

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::ProcessSecondChanceBoundary(LinearScan *this,BranchInstr *branchInstr)

{
  code *pcVar1;
  anon_class_16_2_f2001897 fn;
  Lifetime **this_00;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Type_conflict node;
  Type *ppLVar5;
  MultiBranchInstr *this_01;
  LabelInstr *branchLabel_00;
  LabelInstr *branchLabel;
  MultiBranchInstr *multiBranchInstr;
  Lifetime **lifetime;
  Iterator __iter;
  BranchInstr *branchInstr_local;
  LinearScan *this_local;
  
  __iter.current = (NodeBase *)branchInstr;
  BVar3 = Func::HasTry(this->func);
  if ((BVar3 == 0) || (bVar2 = Func::DoOptimizeTry(this->func), bVar2)) {
    if ((this->currentOpHelperBlock != (OpHelperBlock *)0x0) &&
       (this->currentOpHelperBlock->opHelperEndInstr == (Instr *)__iter.current)) {
      _lifetime = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                            (&this->opHelperSpilledLiveranges->
                              super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
      while( true ) {
        if (__iter.list == (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        this_00 = lifetime;
        node = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar2 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node)
        ;
        if (bVar2) break;
        SListNodeBase<Memory::ArenaAllocator>::Next
                  (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        ppLVar5 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)&lifetime);
        if ((*(ushort *)&(*ppLVar5)->field_0x9c >> 6 & 1) == 0) {
          if ((*(ushort *)&(*ppLVar5)->field_0x9c >> 9 & 1) != 0) {
            BVUnitT<unsigned_long>::Set(&this->secondChanceRegs,(uint)(*ppLVar5)->reg);
          }
          this->regContent[(*ppLVar5)->reg] = *ppLVar5;
        }
      }
    }
    bVar2 = IR::BranchInstr::IsMultiBranch((BranchInstr *)__iter.current);
    if (bVar2) {
      this_01 = IR::BranchInstr::AsMultiBrInstr((BranchInstr *)__iter.current);
      fn.branchInstr = (BranchInstr *)__iter.current;
      fn.this = this;
      IR::MultiBranchInstr::
      MapUniqueMultiBrLabels<LinearScan::ProcessSecondChanceBoundary(IR::BranchInstr*)::__0>
                (this_01,fn);
    }
    else {
      branchLabel_00 = IR::BranchInstr::GetTarget((BranchInstr *)__iter.current);
      ProcessSecondChanceBoundaryHelper(this,(BranchInstr *)__iter.current,branchLabel_00);
    }
    SaveRegContent(this,(Instr *)__iter.current);
  }
  return;
}

Assistant:

void
LinearScan::ProcessSecondChanceBoundary(IR::BranchInstr *branchInstr)
{
    if (this->func->HasTry() && !this->func->DoOptimizeTry())
    {
        return;
    }

    if (this->currentOpHelperBlock && this->currentOpHelperBlock->opHelperEndInstr == branchInstr)
    {
        // Lifetimes opHelperSpilled won't get recorded by SaveRegContent().  Do it here.
        FOREACH_SLIST_ENTRY(Lifetime *, lifetime, this->opHelperSpilledLiveranges)
        {
            if (!lifetime->cantOpHelperSpill)
            {
                if (lifetime->isSecondChanceAllocated)
                {
                    this->secondChanceRegs.Set(lifetime->reg);
                }
                this->regContent[lifetime->reg] = lifetime;
            }
        } NEXT_SLIST_ENTRY;
    }

    if(branchInstr->IsMultiBranch())
    {
        IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

        multiBranchInstr->MapUniqueMultiBrLabels([=](IR::LabelInstr * branchLabel) -> void
        {
            this->ProcessSecondChanceBoundaryHelper(branchInstr, branchLabel);
        });
    }
    else
    {
        IR::LabelInstr *branchLabel = branchInstr->GetTarget();
        this->ProcessSecondChanceBoundaryHelper(branchInstr, branchLabel);
    }

    this->SaveRegContent(branchInstr);
}